

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.hpp
# Opt level: O2

void __thiscall
Qentem::Array<unsigned_int>::Array(Array<unsigned_int> *this,Array<unsigned_int> *src)

{
  SizeT SVar1;
  
  this->storage_ = (uint *)0x0;
  this->index_ = 0;
  SVar1 = src->index_;
  this->capacity_ = SVar1;
  if (SVar1 != 0) {
    this->index_ = SVar1;
    copyArray(this,src);
    return;
  }
  return;
}

Assistant:

Array(const Array &src) : capacity_{src.Size()} {
        if (src.IsNotEmpty()) {
            setSize(src.Size());
            copyArray(src);
        }
    }